

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

Vec_Ptr_t * Abc_FrameExportPtr(void)

{
  Abc_Frame_t *pAVar1;
  Bac_Man_t *p_00;
  Bac_Man_t *p;
  Vec_Ptr_t *vPtr;
  
  pAVar1 = Abc_FrameGetGlobalFrame();
  if (pAVar1 == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not started.\n");
    vPtr = (Vec_Ptr_t *)0x0;
  }
  else {
    pAVar1 = Abc_FrameGetGlobalFrame();
    p_00 = Bac_AbcGetMan(pAVar1);
    if (p_00 == (Bac_Man_t *)0x0) {
      printf("There is no CBA design present.\n");
    }
    vPtr = Bac_PtrDeriveFromCba(p_00);
    if (vPtr == (Vec_Ptr_t *)0x0) {
      printf("Converting to Ptr has failed.\n");
    }
  }
  return vPtr;
}

Assistant:

Vec_Ptr_t * Abc_FrameExportPtr()
{
    Vec_Ptr_t * vPtr;
    Bac_Man_t * p;
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    p = Bac_AbcGetMan( Abc_FrameGetGlobalFrame() );
    if ( p == NULL )
        printf( "There is no CBA design present.\n" );
    vPtr = Bac_PtrDeriveFromCba( p );
    if ( vPtr == NULL )
        printf( "Converting to Ptr has failed.\n" );
    return vPtr;
}